

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void freeauthor(rnnauthor *author)

{
  int local_14;
  int i;
  rnnauthor *author_local;
  
  for (local_14 = 0; local_14 < author->nicknamesnum; local_14 = local_14 + 1) {
    free(author->nicknames[local_14]);
  }
  free(author->nicknames);
  free(author->contributions);
  free(author->email);
  free(author->license);
  free(author->name);
  free(author);
  return;
}

Assistant:

static void freeauthor(struct rnnauthor *author) {
	int i;
	for (i = 0; i < author->nicknamesnum; i++)
		free(author->nicknames[i]);
	free(author->nicknames);

	free(author->contributions);
	free(author->email);
	free(author->license);
	free(author->name);
	free(author);
}